

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_types.h
# Opt level: O0

Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
 viras::
 quot<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
           (Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
            t,Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *p)

{
  Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  x;
  Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  lhs;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *in_RDX;
  TermList in_RDI;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  WVar1;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
  *in_stack_ffffffffffffff48;
  TermList in_stack_ffffffffffffff50;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_ffffffffffffffd0;
  
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
             *)in_stack_ffffffffffffff50._content,
            (Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
             *)in_stack_ffffffffffffff48);
  lhs.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content = in_RDI._content;
  lhs.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .config = in_RDX;
  sugar::operator/(lhs,in_stack_ffffffffffffffd0);
  x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content = in_stack_ffffffffffffff50._content;
  x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .config = in_stack_ffffffffffffff48;
  WVar1 = (WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
           )floor<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
                      (x);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::~Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)0x6d55f7);
  return (Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
          )WVar1;
}

Assistant:

Term<C> quot(Term<C> t, Numeral<C> p) { return floor(t / p); }